

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_38f65::P::parseInt(P *this,string *input,int64_t *out)

{
  int iVar1;
  bool bVar2;
  bad_coercion *anon_var_0;
  undefined1 local_98 [8];
  pair<bool,_ccs::Value> pr;
  int64_t *out_local;
  string *input_local;
  P *this_local;
  
  pr.second.name_.field_2._8_8_ = out;
  parseAndReturnValue((pair<bool,_ccs::Value> *)local_98,this,input);
  bVar2 = (local_98[0] & 1U) != 0;
  if (bVar2) {
    iVar1 = ::ccs::Value::asInt((Value *)&pr);
    *(long *)pr.second.name_.field_2._8_8_ = (long)iVar1;
  }
  std::pair<bool,_ccs::Value>::~pair((pair<bool,_ccs::Value> *)local_98);
  return bVar2;
}

Assistant:

bool parseInt(const std::string &input, int64_t &out) {
    auto pr = parseAndReturnValue(input);
    if (!pr.first) return false;
    try {
      out = pr.second.asInt();
    } catch (ccs::bad_coercion &) {
      return false;
    }
    return true;
  }